

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

void cram_ref_incr(refs_t *r,int id)

{
  int64_t *piVar1;
  ref_entry *prVar2;
  
  pthread_mutex_lock((pthread_mutex_t *)&r->lock);
  if ((-1 < id) && (prVar2 = r->ref_id[(uint)id], prVar2->seq != (char *)0x0)) {
    if (r->last_id == id) {
      r->last_id = -1;
    }
    piVar1 = &prVar2->count;
    *piVar1 = *piVar1 + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&r->lock);
  return;
}

Assistant:

void cram_ref_incr(refs_t *r, int id) {
    pthread_mutex_lock(&r->lock);
    cram_ref_incr_locked(r, id);
    pthread_mutex_unlock(&r->lock);
}